

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O2

void * Res_SatProveUnsat(Abc_Ntk_t *pAig,Vec_Ptr_t *vFanins)

{
  long *plVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  sat_solver *s;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  plVar1 = (long *)Vec_PtrEntry(vFanins,0);
  if (((Abc_Ntk_t *)*plVar1 == pAig) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 3)) {
    p = Abc_NtkDfsNodes(pAig,(Abc_Obj_t **)vFanins->pArray,vFanins->nSize);
    pAVar2 = Abc_AigConst1(pAig);
    (pAVar2->field_6).pTemp = (void *)0x0;
    for (aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1; iVar5 = aVar4.iTemp + -1,
        iVar5 < pAig->vPis->nSize; aVar4.pTemp = (void *)((long)&(aVar4.pCopy)->pNtk + 1)) {
      pAVar2 = Abc_NtkPi(pAig,iVar5);
      pAVar2->field_6 = aVar4;
    }
    lVar7 = 0;
    while( true ) {
      lVar6 = lVar7 + (long)aVar4.pTemp;
      if (p->nSize <= (int)lVar7) break;
      pvVar3 = Vec_PtrEntry(p,(int)lVar7);
      *(long *)((long)pvVar3 + 0x40) = lVar6;
      lVar7 = lVar7 + 1;
    }
    for (iVar5 = 0; iVar5 < vFanins->nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(vFanins,iVar5);
      *(long *)((long)pvVar3 + 0x40) = lVar6;
      lVar6 = lVar6 + 1;
    }
    s = sat_solver_new();
    sat_solver_store_alloc(s);
    pAVar2 = Abc_AigConst1(pAig);
    Res_SatAddConst1(s,(pAVar2->field_6).iTemp,0);
    for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
      plVar1 = (long *)Vec_PtrEntry(p,iVar5);
      lVar7 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
      Res_SatAddAnd(s,(int)plVar1[8],*(int *)(*(long *)(lVar7 + (long)*(int *)plVar1[4] * 8) + 0x40)
                    ,*(int *)(*(long *)(lVar7 + (long)((int *)plVar1[4])[1] * 8) + 0x40),
                    *(uint *)((long)plVar1 + 0x14) >> 10 & 1,
                    *(uint *)((long)plVar1 + 0x14) >> 0xb & 1);
    }
    Vec_PtrFree(p);
    for (iVar5 = 0; iVar5 < vFanins->nSize; iVar5 = iVar5 + 1) {
      plVar1 = (long *)Vec_PtrEntry(vFanins,iVar5);
      Res_SatAddEqual(s,(int)plVar1[8],
                      *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                        (long)*(int *)plVar1[4] * 8) + 0x40),
                      *(uint *)((long)plVar1 + 0x14) >> 10 & 1);
    }
    pvVar3 = Vec_PtrEntry(vFanins,0);
    Res_SatAddConst1(s,*(int *)((long)pvVar3 + 0x40),0);
    pvVar3 = Vec_PtrEntry(vFanins,1);
    Res_SatAddConst1(s,*(int *)((long)pvVar3 + 0x40),0);
    sat_solver_store_mark_clauses_a(s);
    pvVar3 = Vec_PtrEntry(vFanins,1);
    Sat_SolverDoubleClauses(s,*(int *)((long)pvVar3 + 0x40));
    for (iVar5 = 2; iVar5 < vFanins->nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(vFanins,iVar5);
      Res_SatAddEqual(s,*(int *)((long)pvVar3 + 0x40),*(int *)((long)pvVar3 + 0x40) + (int)lVar6,0);
    }
    sat_solver_store_mark_roots(s);
    pvVar3 = (void *)0x0;
    iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
    if (iVar5 == -1) {
      pvVar3 = sat_solver_store_release(s);
    }
    sat_solver_delete(s);
    return pvVar3;
  }
  __assert_fail("pObj->pNtk == pAig && Abc_ObjIsPo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                ,0x3e,"void *Res_SatProveUnsat(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

void * Res_SatProveUnsat( Abc_Ntk_t * pAig, Vec_Ptr_t * vFanins )
{
    void * pCnf = NULL;
    sat_solver * pSat;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, nNodes, status;

    // make sure fanins contain POs of the AIG
    pObj = (Abc_Obj_t *)Vec_PtrEntry( vFanins, 0 );
    assert( pObj->pNtk == pAig && Abc_ObjIsPo(pObj) );

    // collect reachable nodes
    vNodes = Abc_NtkDfsNodes( pAig, (Abc_Obj_t **)vFanins->pArray, vFanins->nSize );

    // assign unique numbers to each node
    nNodes = 0;
    Abc_AigConst1(pAig)->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Abc_NtkForEachPi( pAig, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i ) // useful POs
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;

    // start the solver
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat );

    // add clause for the constant node
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)Abc_AigConst1(pAig)->pCopy, 0 );
    // add clauses for AND gates
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Res_SatAddAnd( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, (int)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pCopy, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    Vec_PtrFree( vNodes );
    // add clauses for POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );
    // add trivial clauses
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 0);
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // care-set
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 1);
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // on-set

    // bookmark the clauses of A
    sat_solver_store_mark_clauses_a( pSat );

    // duplicate the clauses
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 1);
    Sat_SolverDoubleClauses( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy );
    // add the equality constraints
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vFanins, pObj, i, 2 )
        Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, ((int)(ABC_PTRUINT_T)pObj->pCopy) + nNodes, 0 );

    // bookmark the roots
    sat_solver_store_mark_roots( pSat );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        pCnf = sat_solver_store_release( pSat );
//        printf( "unsat\n" );
    }
    else if ( status == l_True )
    {
//        printf( "sat\n" );
    }
    else
    {
//        printf( "undef\n" );
    }
    sat_solver_delete( pSat );
    return pCnf;
}